

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_dwa_encoder.h
# Opt level: O0

exr_result_t
LossyDctEncoderCsc_construct
          (LossyDctEncoder *e,float quantBaseError,DctCoderChannelData *rowPtrsR,
          DctCoderChannelData *rowPtrsG,DctCoderChannelData *rowPtrsB,uint8_t *packedAc,
          uint8_t *packedDc,uint16_t *toNonlinear,int width,int height)

{
  exr_result_t eVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  exr_result_t rv;
  int in_stack_000001d8;
  int in_stack_000001dc;
  uint16_t *in_stack_000001e0;
  uint8_t *in_stack_000001e8;
  uint8_t *in_stack_000001f0;
  float in_stack_000001fc;
  LossyDctEncoder *in_stack_00000200;
  
  eVar1 = LossyDctEncoder_base_construct
                    (in_stack_00000200,in_stack_000001fc,in_stack_000001f0,in_stack_000001e8,
                     in_stack_000001e0,in_stack_000001dc,in_stack_000001d8);
  *(undefined8 *)(in_RDI + 0x18) = in_RSI;
  *(undefined8 *)(in_RDI + 0x20) = in_RDX;
  *(undefined8 *)(in_RDI + 0x28) = in_RCX;
  *(undefined4 *)(in_RDI + 0x30) = 3;
  return eVar1;
}

Assistant:

exr_result_t
LossyDctEncoderCsc_construct (
    LossyDctEncoder*     e,
    float                quantBaseError,
    DctCoderChannelData* rowPtrsR,
    DctCoderChannelData* rowPtrsG,
    DctCoderChannelData* rowPtrsB,
    uint8_t*             packedAc,
    uint8_t*             packedDc,
    const uint16_t*      toNonlinear,
    int                  width,
    int                  height)
{
    exr_result_t rv;

    rv = LossyDctEncoder_base_construct (
        e, quantBaseError, packedAc, packedDc, toNonlinear, width, height);
    e->_channel_encode_data[0]    = rowPtrsR;
    e->_channel_encode_data[1]    = rowPtrsG;
    e->_channel_encode_data[2]    = rowPtrsB;
    e->_channel_encode_data_count = 3;

    return rv;
}